

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void name_public_cb(Fl_Choice *i,void *v)

{
  Fl_Type *pFVar1;
  Fl_Menu_Item *pFVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  Fl_Class_Type *pFVar7;
  Fl_Type **ppFVar8;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,(uint)(0 < current_widget->public_));
    pFVar7 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    pp_Var3 = (i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget;
    if (pFVar7 != (Fl_Class_Type *)0x0) {
      (*pp_Var3[6])();
      return;
    }
    (*pp_Var3[5])(i);
    return;
  }
  bVar4 = false;
  ppFVar8 = &Fl_Type::first;
  while (pFVar1 = *ppFVar8, pFVar1 != (Fl_Type *)0x0) {
    if (pFVar1->selected != '\0') {
      iVar5 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1);
      if (iVar5 != 0) {
        pFVar2 = (i->super_Fl_Menu_).value_;
        uVar6 = 0xffffffff;
        if (pFVar2 != (Fl_Menu_Item *)0x0) {
          uVar6 = (undefined4)(((long)pFVar2 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
        }
        *(undefined4 *)&pFVar1[1].factory = uVar6;
        bVar4 = true;
      }
    }
    ppFVar8 = &pFVar1->next;
  }
  if (bVar4) {
    set_modflag(1);
    redraw_browser();
    return;
  }
  return;
}

Assistant:

void name_public_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_>0);
    if (current_widget->is_in_class()) i->hide(); else i->show();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	((Fl_Widget_Type*)o)->public_ = i->value();
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}